

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

ssize_t __thiscall Arcflow::read(Arcflow *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  undefined4 extraout_var;
  runtime_error *prVar3;
  void *__buf_00;
  size_t __nbytes_00;
  undefined4 in_register_00000034;
  char *__buf_01;
  char _error_msg_ [256];
  char acStack_118 [264];
  
  __buf_01 = acStack_118;
  if (this->ready == false) {
    bVar1 = check_ext((char *)CONCAT44(in_register_00000034,__fd),".afg");
    if (!bVar1) {
      snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "check_ext(fname, \".afg\")",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x26d);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,acStack_118);
      goto LAB_0010b253;
    }
    __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"r");
    if (__stream != (FILE *)0x0) {
      read(this,(int)__stream,__buf_00,__nbytes);
      iVar2 = fclose(__stream);
      if (this->ready != false) {
        return CONCAT44(extraout_var,iVar2);
      }
      snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "ready == true",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x275);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,acStack_118);
      goto LAB_0010b253;
    }
    perror("fopen");
    snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fin != NULL",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x272);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,acStack_118);
    read((int)prVar3,__buf_01,__nbytes_00);
  }
  snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == false",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x26c);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,acStack_118);
LAB_0010b253:
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::read(const char *fname) {
	throw_assert(ready == false);
	throw_assert(check_ext(fname, ".afg"));
	FILE *fin = fopen(fname, "r");
	if (fin == NULL) {
		perror("fopen");
	}
	throw_assert(fin != NULL);
	read(fin);
	fclose(fin);
	throw_assert(ready == true);
}